

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O0

UChar32 * u_strToUTF32WithSub_63
                    (UChar32 *dest,int32_t destCapacity,int32_t *pDestLength,UChar *src,
                    int32_t srcLength,UChar32 subchar,int32_t *pNumSubstitutions,
                    UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint uVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *local_78;
  uint *local_68;
  int local_60;
  int local_5c;
  int32_t numSubstitutions;
  int32_t reqLength;
  UChar32 *pDest;
  UChar32 *destLimit;
  UChar ch2;
  UChar *pUStack_40;
  UChar32 ch;
  UChar *srcLimit;
  UChar32 subchar_local;
  int32_t srcLength_local;
  UChar *src_local;
  int32_t *pDestLength_local;
  int32_t destCapacity_local;
  UChar32 *dest_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((((src == (UChar *)0x0) && (srcLength != 0)) || (srcLength < -1)) || (destCapacity < 0)) ||
       (((dest == (UChar32 *)0x0 && (0 < destCapacity)) ||
        ((0x10ffff < subchar || ((subchar & 0xfffff800U) == 0xd800)))))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      dest_local = (UChar32 *)0x0;
    }
    else {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      if (dest == (UChar32 *)0x0) {
        local_68 = (uint *)0x0;
      }
      else {
        local_68 = (uint *)(dest + destCapacity);
      }
      local_5c = 0;
      local_60 = 0;
      _numSubstitutions = (uint *)dest;
      _subchar_local = src;
      if (srcLength < 0) {
        while (uVar2 = (uint)(ushort)*_subchar_local, uVar2 != 0 && (uVar2 & 0xfffff800) != 0xd800)
        {
          _subchar_local = _subchar_local + 1;
          if (_numSubstitutions < local_68) {
            *_numSubstitutions = uVar2;
            _numSubstitutions = _numSubstitutions + 1;
          }
          else {
            local_5c = local_5c + 1;
          }
        }
        pUStack_40 = _subchar_local;
        if (uVar2 != 0) {
          do {
            pUVar3 = pUStack_40 + 1;
            pUVar4 = pUStack_40 + 1;
            pUStack_40 = pUVar3;
          } while (*pUVar4 != L'\0');
        }
      }
      else {
        if (src == (UChar *)0x0) {
          local_78 = (UChar *)0x0;
        }
        else {
          local_78 = src + srcLength;
        }
        pUStack_40 = local_78;
        _numSubstitutions = (uint *)dest;
      }
      while (_subchar_local < pUStack_40) {
        pUVar4 = _subchar_local + 1;
        destLimit._4_4_ = (uint)(ushort)*_subchar_local;
        if ((destLimit._4_4_ & 0xfffff800) == 0xd800) {
          if ((((*_subchar_local & 0x400U) == 0) && (pUVar4 < pUStack_40)) &&
             ((*pUVar4 & 0xfc00U) == 0xdc00)) {
            destLimit._4_4_ = destLimit._4_4_ * 0x400 + (uint)(ushort)*pUVar4 + 0xfca02400;
            pUVar4 = _subchar_local + 2;
          }
          else {
            if (subchar < 0) {
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (UChar32 *)0x0;
            }
            local_60 = local_60 + 1;
            destLimit._4_4_ = subchar;
          }
        }
        _subchar_local = pUVar4;
        if (_numSubstitutions < local_68) {
          *_numSubstitutions = destLimit._4_4_;
          _numSubstitutions = _numSubstitutions + 1;
        }
        else {
          local_5c = local_5c + 1;
        }
      }
      local_5c = (int)((long)_numSubstitutions - (long)dest >> 2) + local_5c;
      if (pDestLength != (int32_t *)0x0) {
        *pDestLength = local_5c;
      }
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = local_60;
      }
      u_terminateUChar32s_63(dest,destCapacity,local_5c,pErrorCode);
      dest_local = dest;
    }
  }
  else {
    dest_local = (UChar32 *)0x0;
  }
  return dest_local;
}

Assistant:

U_CAPI UChar32* U_EXPORT2 
u_strToUTF32WithSub(UChar32 *dest,
             int32_t destCapacity,
             int32_t *pDestLength,
             const UChar *src,
             int32_t srcLength,
             UChar32 subchar, int32_t *pNumSubstitutions,
             UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    UChar32 ch;
    UChar ch2;
    UChar32 *destLimit;
    UChar32 *pDest;
    int32_t reqLength;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = 0;
    }

    pDest = dest;
    destLimit = (dest!=NULL)?(dest + destCapacity):NULL;
    reqLength = 0;
    numSubstitutions = 0;

    if(srcLength < 0) {
        /* simple loop for conversion of a NUL-terminated BMP string */
        while((ch=*src) != 0 && !U16_IS_SURROGATE(ch)) {
            ++src;
            if(pDest < destLimit) {
                *pDest++ = ch;
            } else {
                ++reqLength;
            }
        }
        srcLimit = src;
        if(ch != 0) {
            /* "complicated" case, find the end of the remaining string */
            while(*++srcLimit != 0) {}
        }
    } else {
        srcLimit = (src!=NULL)?(src + srcLength):NULL;
    }

    /* convert with length */
    while(src < srcLimit) {
        ch = *src++;
        if(!U16_IS_SURROGATE(ch)) {
            /* write or count ch below */
        } else if(U16_IS_SURROGATE_LEAD(ch) && src < srcLimit && U16_IS_TRAIL(ch2 = *src)) {
            ++src;
            ch = U16_GET_SUPPLEMENTARY(ch, ch2);
        } else if((ch = subchar) < 0) {
            /* unpaired surrogate */
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return NULL;
        } else {
            ++numSubstitutions;
        }
        if(pDest < destLimit) {
            *pDest++ = ch;
        } else {
            ++reqLength;
        }
    }

    reqLength += (int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }
    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = numSubstitutions;
    }

    /* Terminate the buffer */
    u_terminateUChar32s(dest, destCapacity, reqLength, pErrorCode);

    return dest;
}